

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int modified_get_undeliverable_here(MODIFIED_HANDLE modified,_Bool *undeliverable_here_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  MODIFIED_INSTANCE *modified_instance;
  uint32_t item_count;
  int result;
  _Bool *undeliverable_here_value_local;
  MODIFIED_HANDLE modified_local;
  
  if (modified == (MODIFIED_HANDLE)0x0) {
    modified_instance._4_4_ = 0x47b7;
  }
  else {
    _item_count = undeliverable_here_value;
    undeliverable_here_value_local = (_Bool *)modified;
    iVar1 = amqpvalue_get_composite_item_count
                      (modified->composite_value,(uint32_t *)&modified_instance);
    if (iVar1 == 0) {
      if ((uint)modified_instance < 2) {
        modified_instance._4_4_ = 0x47c5;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(modified->composite_value,1);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          modified_instance._4_4_ = 0x47cd;
        }
        else {
          iVar1 = amqpvalue_get_boolean(value,_item_count);
          if (iVar1 == 0) {
            modified_instance._4_4_ = 0;
          }
          else {
            modified_instance._4_4_ = 0x47d4;
          }
        }
      }
    }
    else {
      modified_instance._4_4_ = 0x47bf;
    }
  }
  return modified_instance._4_4_;
}

Assistant:

int modified_get_undeliverable_here(MODIFIED_HANDLE modified, bool* undeliverable_here_value)
{
    int result;

    if (modified == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)modified;
        if (amqpvalue_get_composite_item_count(modified_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 1)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(modified_instance->composite_value, 1);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_boolean(item_value, undeliverable_here_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}